

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

_Bool ggml_validate_row_data(ggml_type type,void *data,size_t nbytes)

{
  FILE *__stream;
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong in_RDX;
  long in_RSI;
  ggml_type in_EDI;
  size_t i_25;
  block_iq4_nl *q_21;
  size_t i_24;
  block_iq4_xs *q_20;
  size_t i_23;
  block_iq3_s *q_19;
  size_t i_22;
  block_iq3_xxs *q_18;
  size_t i_21;
  block_iq2_s *q_17;
  size_t i_20;
  block_iq2_xs *q_16;
  size_t i_19;
  block_iq2_xxs *q_15;
  uint16_t *sc;
  iq1m_scale_t scale;
  size_t i_18;
  block_iq1_m *q_14;
  size_t i_17;
  block_iq1_s *q_13;
  size_t i_16;
  block_tq2_0 *q_12;
  size_t i_15;
  block_tq1_0 *q_11;
  size_t i_14;
  block_q8_K *q_10;
  size_t i_13;
  block_q6_K *q_9;
  size_t i_12;
  block_q5_K *q_8;
  size_t i_11;
  block_q4_K *q_7;
  size_t i_10;
  block_q3_K *q_6;
  size_t i_9;
  block_q2_K *q_5;
  size_t i_8;
  block_q8_0 *q_4;
  size_t i_7;
  block_q5_1 *q_3;
  size_t i_6;
  block_q5_0 *q_2;
  size_t i_5;
  block_q4_1 *q_1;
  size_t i_4;
  block_q4_0 *q;
  size_t i_3;
  double *f_3;
  size_t i_2;
  float *f_2;
  size_t i_1;
  ggml_fp16_t *f_1;
  size_t i;
  unsigned_short *f;
  int infs;
  int nans;
  size_t nb;
  ulong local_1d8;
  ulong local_1c8;
  ulong local_1b8;
  ulong local_1a8;
  ulong local_198;
  ulong local_188;
  ulong local_178;
  ulong local_158;
  ulong local_148;
  ulong local_138;
  ulong local_128;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  ulong local_e8;
  ulong local_d8;
  ulong local_c8;
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  uint local_28;
  uint local_24;
  _Bool local_1;
  
  if (in_EDI < GGML_TYPE_COUNT) {
    sVar2 = ggml_type_size(in_EDI);
    __stream = _stderr;
    if (in_RDX % sVar2 == 0) {
      sVar2 = ggml_type_size(in_EDI);
      uVar4 = in_RDX / sVar2;
      uVar5 = (ulong)in_EDI;
      switch(uVar5) {
      case 0:
        for (local_58 = 0; local_58 < uVar4; local_58 = local_58 + 1) {
          _Var1 = validate_float((float)uVar5,in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 1:
        for (local_48 = 0; local_48 < uVar4; local_48 = local_48 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 2:
        for (local_78 = 0; local_78 < uVar4; local_78 = local_78 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 3:
        for (local_88 = 0; local_88 < uVar4; local_88 = local_88 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if ((!_Var1) || (_Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX), !_Var1)) {
            return false;
          }
        }
        break;
      default:
        fprintf(_stderr,"%s: invalid type %d\n","ggml_validate_row_data",(ulong)in_EDI);
        return false;
      case 6:
        for (local_98 = 0; local_98 < uVar4; local_98 = local_98 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 7:
        for (local_a8 = 0; local_a8 < uVar4; local_a8 = local_a8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if ((!_Var1) || (_Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX), !_Var1)) {
            return false;
          }
        }
        break;
      case 8:
        for (local_b8 = 0; local_b8 < uVar4; local_b8 = local_b8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 10:
        for (local_c8 = 0; local_c8 < uVar4; local_c8 = local_c8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if ((!_Var1) || (_Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX), !_Var1)) {
            return false;
          }
        }
        break;
      case 0xb:
        for (local_d8 = 0; local_d8 < uVar4; local_d8 = local_d8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0xc:
        for (local_e8 = 0; local_e8 < uVar4; local_e8 = local_e8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if ((!_Var1) || (_Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX), !_Var1)) {
            return false;
          }
        }
        break;
      case 0xd:
        for (local_f8 = 0; local_f8 < uVar4; local_f8 = local_f8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if ((!_Var1) || (_Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX), !_Var1)) {
            return false;
          }
        }
        break;
      case 0xe:
        for (local_108 = 0; local_108 < uVar4; local_108 = local_108 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0xf:
        for (local_118 = 0; local_118 < uVar4; local_118 = local_118 + 1) {
          _Var1 = validate_float((float)uVar5,in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x10:
        for (local_178 = 0; local_178 < uVar4; local_178 = local_178 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x11:
        for (local_188 = 0; local_188 < uVar4; local_188 = local_188 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x12:
        for (local_1a8 = 0; local_1a8 < uVar4; local_1a8 = local_1a8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x13:
        for (local_148 = 0; local_148 < uVar4; local_148 = local_148 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x14:
        for (local_1d8 = 0; local_1d8 < uVar4; local_1d8 = local_1d8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x15:
        for (local_1b8 = 0; local_1b8 < uVar4; local_1b8 = local_1b8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x16:
        for (local_198 = 0; local_198 < uVar4; local_198 = local_198 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x17:
        for (local_1c8 = 0; local_1c8 < uVar4; local_1c8 = local_1c8 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        break;
      case 0x1c:
        for (local_68 = 0; local_68 < uVar4; local_68 = local_68 + 1) {
          _Var1 = validate_float((float)uVar5,in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x1d:
        for (local_158 = 0; local_158 < uVar4; local_158 = local_158 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x1e:
        local_24 = 0;
        local_28 = 0;
        for (local_38 = 0; local_38 < uVar4; local_38 = local_38 + 1) {
          local_24 = (0x7f80 < (*(ushort *)(in_RSI + local_38 * 2) & 0x7fff)) + local_24;
          local_28 = ((*(ushort *)(in_RSI + local_38 * 2) & 0x7fff) == 0x7f80) + local_28;
        }
        if (local_24 != 0) {
          fprintf(_stderr,"%s: found %d NaNs in row of %zu BF16 values\n","ggml_validate_row_data",
                  (ulong)local_24,uVar4);
          return false;
        }
        if (local_28 != 0) {
          fprintf(_stderr,"%s: found %d infinities in row of %zu BF16 values\n",
                  "ggml_validate_row_data",(ulong)local_28,uVar4);
          return false;
        }
        break;
      case 0x22:
        for (local_128 = 0; local_128 < uVar4; local_128 = local_128 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
        break;
      case 0x23:
        for (local_138 = 0; local_138 < uVar4; local_138 = local_138 + 1) {
          _Var1 = validate_fp16((ggml_fp16_t)(uVar5 >> 0x20),in_RDX);
          if (!_Var1) {
            return false;
          }
        }
      }
      local_1 = true;
    }
    else {
      pcVar3 = ggml_type_name(in_EDI);
      sVar2 = ggml_type_size(in_EDI);
      fprintf(__stream,"%s: invalid size %zu for type %s (type size = %zu)\n",
              "ggml_validate_row_data",in_RDX,pcVar3,sVar2);
      local_1 = false;
    }
  }
  else {
    fprintf(_stderr,"%s: invalid type %d\n","ggml_validate_row_data",(ulong)in_EDI);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ggml_validate_row_data(enum ggml_type type, const void * data, size_t nbytes) {
    if (type < 0 || type >= GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid type %d\n", __func__, type);
        return false;
    }

    if (nbytes % ggml_type_size(type) != 0) {
        fprintf(stderr, "%s: invalid size %zu for type %s (type size = %zu)\n", __func__, nbytes, ggml_type_name(type), ggml_type_size(type));
        return false;
    }

    const size_t nb = nbytes/ggml_type_size(type);

    switch (type) {
        case GGML_TYPE_BF16:
            {
                int nans = 0;
                int infs = 0;
                const unsigned short * f = (const unsigned short *) data;
                for (size_t i = 0; i < nb; ++i) {
                    nans += (f[i] & 0x7fff) > 0x7f80;
                    infs += (f[i] & 0x7fff) == 0x7f80;
                }
                if (nans) {
                    fprintf(stderr, "%s: found %d NaNs in row of %zu BF16 values\n", __func__, nans, nb);
                    return false;
                }
                if (infs) {
                    fprintf(stderr, "%s: found %d infinities in row of %zu BF16 values\n", __func__, infs, nb);
                    return false;
                }
            } break;
        case GGML_TYPE_F16:
            {
                const ggml_fp16_t * f = (const ggml_fp16_t *) data;
                size_t i = 0;
#if defined(__AVX2__)
                for (; i + 15 < nb; i += 16) {
                    __m256i v = _mm256_loadu_si256((const __m256i *)(f + i));
                    __m256i vexp = _mm256_and_si256(v, _mm256_set1_epi16(0x7c00));
                    __m256i cmp = _mm256_cmpeq_epi16(vexp, _mm256_set1_epi16(0x7c00));
                    int mask = _mm256_movemask_epi8(cmp);
                    if (mask) {
                        for (size_t j = 0; j < 16; ++j) {
                            if (!validate_fp16(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#elif defined(__ARM_NEON)
                for (; i + 7 < nb; i += 8) {
                    uint16x8_t v = vld1q_u16(f + i);
                    uint16x8_t vexp = vandq_u16(v, vdupq_n_u16(0x7c00));
                    uint16x8_t cmp = vceqq_u16(vexp, vdupq_n_u16(0x7c00));
                    uint64_t mask = vget_lane_u64(vreinterpret_u64_u8(vshrn_n_u16(cmp, 4)), 0);
                    if (mask) {
                        for (size_t j = 0; j < 8; ++j) {
                            if (!validate_fp16(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#endif
                for (; i < nb; ++i) {
                    if (!validate_fp16(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_F32:
            {
                const float * f = (const float *) data;
                size_t i = 0;
#if defined(__AVX2__)
                for (; i + 7 < nb; i += 8) {
                    __m256i v = _mm256_loadu_si256((const __m256i *)(f + i));
                    __m256i vexp = _mm256_and_si256(v, _mm256_set1_epi32(0x7f800000));
                    __m256i cmp = _mm256_cmpeq_epi32(vexp, _mm256_set1_epi32(0x7f800000));
                    int mask = _mm256_movemask_epi8(cmp);
                    if (mask) {
                        for (size_t j = 0; j < 8; ++j) {
                            if (!validate_float(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#elif defined(__ARM_NEON)
                for (; i + 3 < nb; i += 4) {
                    uint32x4_t v = vld1q_u32((const uint32_t *)f + i);
                    uint32x4_t vexp = vandq_u32(v, vdupq_n_u32(0x7f800000));
                    uint32x4_t cmp = vceqq_u32(vexp, vdupq_n_u32(0x7f800000));
                    uint64_t mask = vget_lane_u64(vreinterpret_u64_u16(vshrn_n_u32(cmp, 8)), 0);
                    if (mask) {
                        for (size_t j = 0; j < 4; ++j) {
                            if (!validate_float(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#endif
                for (; i < nb; ++i) {
                    if (!validate_float(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_F64:
            {
                const double * f = (const double *) data;
                for (size_t i = 0; i < nb; ++i) {
                    if (!validate_float(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_Q4_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q4_0, data, nb);
            } break;
        case GGML_TYPE_Q4_1:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q4_1, data, nb, d, m);
            } break;
        case GGML_TYPE_Q5_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q5_0, data, nb);
            } break;
        case GGML_TYPE_Q5_1:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q5_1, data, nb, d, m);
            } break;
        case GGML_TYPE_Q8_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q8_0, data, nb);
            } break;
        case GGML_TYPE_Q2_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q2_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q3_K:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q3_K, data, nb);
            } break;
        case GGML_TYPE_Q4_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q4_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q5_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q5_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q6_K:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q6_K, data, nb);
            } break;
        case GGML_TYPE_Q8_K:
            {
                const block_q8_K * q = (const block_q8_K *) data;
                for (size_t i = 0; i < nb; ++i) {
                    if (!validate_float(q[i].d, i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_TQ1_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_tq1_0, data, nb);
            } break;
        case GGML_TYPE_TQ2_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_tq2_0, data, nb);
            } break;
        case GGML_TYPE_IQ1_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq1_s, data, nb);
            } break;
        case GGML_TYPE_IQ1_M:
            {
                const block_iq1_m * q = (const block_iq1_m *) data;
                for (size_t i = 0; i < nb; ++i) {
                    iq1m_scale_t scale;
                    const uint16_t * sc = (const uint16_t *)q[i].scales;
                    scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
                    if (!validate_fp16(scale.f16, i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_IQ2_XXS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_xxs, data, nb);
            } break;
        case GGML_TYPE_IQ2_XS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_xs, data, nb);
            } break;
        case GGML_TYPE_IQ2_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_s, data, nb);
            } break;
        case GGML_TYPE_IQ3_XXS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq3_xxs, data, nb);
            } break;

        case GGML_TYPE_IQ3_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq3_s, data, nb);
            } break;
        case GGML_TYPE_IQ4_XS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq4_xs, data, nb);
            } break;
        case GGML_TYPE_IQ4_NL:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq4_nl, data, nb);
            } break;

        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_I64:
            // nothing to validate
            break;
        default:
            {
                fprintf(stderr, "%s: invalid type %d\n", __func__, type);
                return false;
            }
    }

    return true;
}